

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setImageLimited<unsigned_char>
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *a)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  setSize(this,a->width,a->height,(long)a->depth);
  iVar3 = this->depth;
  if (0 < iVar3) {
    lVar2 = this->height;
    lVar1 = 0;
    do {
      if (0 < lVar2) {
        lVar5 = this->width;
        lVar4 = 0;
        do {
          if (0 < lVar5) {
            lVar2 = 0;
            do {
              this->img[lVar1][lVar4][lVar2] = a->img[lVar1][lVar4][lVar2];
              lVar2 = lVar2 + 1;
              lVar5 = this->width;
            } while (lVar2 < lVar5);
            lVar2 = this->height;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < lVar2);
        iVar3 = this->depth;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < iVar3);
  }
  return;
}

Assistant:

void setImageLimited(const Image<S> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      for (int j=0; j<depth; j++)
        for (long k=0; k<height; k++)
          for (long i=0; i<width; i++)
          {
            img[j][k][i]=ptraits::limit(static_cast<work_t>(a.get(i, k, j)));
          }
    }